

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_logger.hpp
# Opt level: O1

void duckdb::HTTPLogger::
     TemplatedWriteRequests<std::ofstream,duckdb_httplib::Request,duckdb_httplib::Response>
               (basic_ofstream<char,_std::char_traits<char>_> *out,Request *req,Response *res)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"HTTP Request:\n",0xe);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,anon_var_dwarf_6435659 + 7,1);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,(req->method)._M_dataplus._M_p,(req->method)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(req->path)._M_dataplus._M_p,(req->path)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_6435278 + 8,1);
  for (p_Var2 = (req->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(req->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,anon_var_dwarf_6435659 + 7,1);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)(p_Var2 + 2),(long)p_Var2[2]._M_parent);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_6435278 + 8,1);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\nHTTP Response:\n",0x10);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,anon_var_dwarf_6435659 + 7,1);
  poVar1 = (ostream *)::std::ostream::operator<<(out,res->status);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(res->reason)._M_dataplus._M_p,(res->reason)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(req->version)._M_dataplus._M_p,(req->version)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_6435278 + 8,1);
  for (p_Var2 = (res->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(res->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,anon_var_dwarf_6435659 + 7,1);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)(p_Var2 + 2),(long)p_Var2[2]._M_parent);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_6435278 + 8,1);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,anon_var_dwarf_6435278 + 8,1);
  return;
}

Assistant:

static inline void TemplatedWriteRequests(STREAM &out, const REQUEST &req, const RESPONSE &res) {
		out << "HTTP Request:\n";
		out << "\t" << req.method << " " << req.path << "\n";
		for (auto &entry : req.headers) {
			out << "\t" << entry.first << ": " << entry.second << "\n";
		}
		out << "\nHTTP Response:\n";
		out << "\t" << res.status << " " << res.reason << " " << req.version << "\n";
		for (auto &entry : res.headers) {
			out << "\t" << entry.first << ": " << entry.second << "\n";
		}
		out << "\n";
	}